

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::BloomFilterPolicy::CreateFilter
          (BloomFilterPolicy *this,Slice *keys,int n,string *dst)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  reference pvVar4;
  uint uVar5;
  int in_EDX;
  size_type in_RDI;
  long in_FS_OFFSET;
  uint32_t bitpos;
  size_t j;
  uint32_t delta;
  uint32_t h;
  int i;
  char *array;
  size_t init_size;
  size_t bytes;
  size_t bits;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  ulong uVar6;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint local_50;
  int local_4c;
  ulong local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = (long)in_EDX * *(long *)(in_RDI + 8);
  if (local_30 < 0x40) {
    local_30 = 0x40;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            (in_stack_ffffffffffffff88);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (size_type)in_stack_ffffffffffffffa0,(char)(in_stack_ffffffffffffff9c >> 0x18));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (in_stack_ffffffffffffffa0,(char)((uint)in_stack_ffffffffffffffac >> 0x18));
  pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),in_RDI);
  for (local_4c = 0; local_4c < in_EDX; local_4c = local_4c + 1) {
    local_50 = BloomHash((Slice *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    uVar3 = local_50 >> 0x11;
    uVar5 = local_50 << 0xf;
    for (uVar6 = 0; uVar6 < *(ulong *)(in_RDI + 0x10); uVar6 = uVar6 + 1) {
      uVar2 = (ulong)local_50 % (local_30 + 7 & 0xfffffffffffffff8);
      in_stack_ffffffffffffff9c = (uint)uVar2;
      pvVar4[in_stack_ffffffffffffff9c >> 3] =
           pvVar4[in_stack_ffffffffffffff9c >> 3] | (byte)(1 << ((byte)uVar2 & 7));
      local_50 = (uVar3 | uVar5) + local_50;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CreateFilter(const Slice* keys, int n, std::string* dst) const override {
    // Compute bloom filter size (in both bits and bytes)
    size_t bits = n * bits_per_key_;

    // For small n, we can see a very high false positive rate.  Fix it
    // by enforcing a minimum bloom filter length.
    if (bits < 64) bits = 64;

    size_t bytes = (bits + 7) / 8;
    bits = bytes * 8;

    const size_t init_size = dst->size();
    dst->resize(init_size + bytes, 0);
    dst->push_back(static_cast<char>(k_));  // Remember # of probes in filter
    char* array = &(*dst)[init_size];
    for (int i = 0; i < n; i++) {
      // Use double-hashing to generate a sequence of hash values.
      // See analysis in [Kirsch,Mitzenmacher 2006].
      uint32_t h = BloomHash(keys[i]);
      const uint32_t delta = (h >> 17) | (h << 15);  // Rotate right 17 bits
      for (size_t j = 0; j < k_; j++) {
        const uint32_t bitpos = h % bits;
        array[bitpos / 8] |= (1 << (bitpos % 8));
        h += delta;
      }
    }
  }